

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemDecTigerWithCreaks.cpp
# Opt level: O1

void __thiscall ProblemDecTigerWithCreaks::FillTransitionModel(ProblemDecTigerWithCreaks *this)

{
  TransitionModelDiscrete *pTVar1;
  Index IVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (*(long *)&(this->super_DecPOMDPDiscrete).field_0x220 != 0) {
    uVar7 = 0;
    do {
      if (*(long *)&(this->super_DecPOMDPDiscrete).field_0x220 != 0) {
        uVar8 = 0;
        do {
          lVar3 = (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).
                                         super_MultiAgentDecisionProcessDiscrete.
                                         super_MultiAgentDecisionProcess + 0x70))(this);
          if (lVar3 != 0) {
            uVar5 = 1;
            do {
              pTVar1 = (this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                       _m_p_tModel;
              (*(pTVar1->super_TransitionModelDiscreteInterface).super_TransitionModel.
                _vptr_TransitionModel[5])(0x3fe0000000000000,pTVar1,uVar7,(ulong)(uVar5 - 1),uVar8);
              uVar6 = (ulong)uVar5;
              uVar4 = (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).
                                             super_MultiAgentDecisionProcessDiscrete.
                                             super_MultiAgentDecisionProcess + 0x70))(this);
              uVar5 = uVar5 + 1;
            } while (uVar6 < uVar4);
          }
          uVar8 = (ulong)((int)uVar8 + 1);
        } while (uVar8 < *(ulong *)&(this->super_DecPOMDPDiscrete).field_0x220);
      }
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (uVar7 < *(ulong *)&(this->super_DecPOMDPDiscrete).field_0x220);
  }
  IVar2 = GetJointActionIndex(this,0,0);
  pTVar1 = (this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_p_tModel;
  (*(pTVar1->super_TransitionModelDiscreteInterface).super_TransitionModel._vptr_TransitionModel[5])
            (0x3ff0000000000000,pTVar1,0,(ulong)IVar2,0);
  pTVar1 = (this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_p_tModel;
  (*(pTVar1->super_TransitionModelDiscreteInterface).super_TransitionModel._vptr_TransitionModel[5])
            (0,pTVar1,0,(ulong)IVar2,1);
  pTVar1 = (this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_p_tModel;
  (*(pTVar1->super_TransitionModelDiscreteInterface).super_TransitionModel._vptr_TransitionModel[5])
            (0x3ff0000000000000,pTVar1,1,(ulong)IVar2,1);
  pTVar1 = (this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_p_tModel;
  (*(pTVar1->super_TransitionModelDiscreteInterface).super_TransitionModel._vptr_TransitionModel[5])
            (0,pTVar1,1,(ulong)IVar2,0);
  return;
}

Assistant:

void ProblemDecTigerWithCreaks::FillTransitionModel()
{
    // add transitions:
    for(Index s1=0; s1<NUMBER_OF_STATES;s1++) 
        for(Index s2=0; s2<NUMBER_OF_STATES;s2++) 
            for(Index ja=0; ja<GetNrJointActions(); ja++)
                SetTransitionProbability(s1, ja, s2, 0.5);

    Index jaListenListen=GetJointActionIndex(LISTEN,LISTEN);
    SetTransitionProbability(SLEFT, jaListenListen, SLEFT, 1.0);
    SetTransitionProbability(SLEFT, jaListenListen, SRIGHT, 0.0);
    SetTransitionProbability(SRIGHT, jaListenListen, SRIGHT, 1.0);
    SetTransitionProbability(SRIGHT, jaListenListen, SLEFT, 0.0);
}